

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O0

NumericTable * __thiscall
notch::io::CSVReader::convertToNumeric
          (NumericTable *__return_storage_ptr__,CSVReader *this,MixedTable *t)

{
  bool bVar1;
  const_reference this_00;
  _Bit_pointer puVar2;
  reference __x;
  reference pvVar3;
  reference pvVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  reference rVar7;
  float local_130;
  mapped_type local_12c;
  float local_128;
  int labelIndex_1;
  string local_120 [4];
  int labelIndex;
  string label;
  reference local_100;
  _Bit_pointer local_f0;
  size_t i_1;
  NumericRow nr;
  vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_> row;
  const_iterator __end2;
  const_iterator __begin2;
  MixedTable *__range2;
  undefined1 local_98 [8];
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
  columnKeys;
  _Bit_pointer local_70;
  size_t i;
  allocator<bool> local_51;
  undefined1 local_50 [8];
  vector<bool,_std::allocator<bool>_> isNumeric;
  size_t ncols;
  MixedTable *t_local;
  CSVReader *this_local;
  NumericTable *nt;
  
  this_00 = core::std::
            vector<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>,_std::allocator<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>_>_>
            ::at(t,0);
  puVar2 = (_Bit_pointer)
           core::std::
           vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>::size
                     (this_00);
  isNumeric.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = puVar2;
  core::std::allocator<bool>::allocator(&local_51);
  core::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_50,(size_type)puVar2,&local_51);
  core::std::allocator<bool>::~allocator(&local_51);
  for (local_70 = (_Bit_pointer)0x0;
      puVar2 = isNumeric.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_end_of_storage,
      local_70 <
      isNumeric.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage; local_70 = (_Bit_pointer)((long)local_70 + 1)) {
    bVar1 = isColumnNumeric(this,t,(size_t)local_70);
    rVar7 = core::std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)local_50,(size_type)local_70);
    columnKeys.
    super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)rVar7._M_p;
    core::std::_Bit_reference::operator=
              ((_Bit_reference *)
               &columnKeys.
                super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,bVar1);
  }
  core::std::
  allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  ::allocator((allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
               *)((long)&__range2 + 7));
  core::std::
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
  ::vector((vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
            *)local_98,(size_type)puVar2,
           (allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
            *)((long)&__range2 + 7));
  core::std::
  allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  ::~allocator((allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                *)((long)&__range2 + 7));
  __range2._6_1_ = 0;
  core::std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(__return_storage_ptr__);
  __end2 = core::std::
           vector<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>,_std::allocator<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>_>_>
           ::begin(t);
  row.super__Vector_base<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)core::std::
                vector<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>,_std::allocator<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>_>_>
                ::end(t);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>_*,_std::vector<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>,_std::allocator<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>_>_>_>
                                *)&row.
                                   super__Vector_base<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    __x = __gnu_cxx::
          __normal_iterator<const_std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>_*,_std::vector<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>,_std::allocator<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>_>_>_>
          ::operator*(&__end2);
    core::std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>::
    vector((vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_> *)
           &nr.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage,__x);
    core::std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&i_1);
    for (local_f0 = (_Bit_pointer)0x0;
        local_f0 <
        isNumeric.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage; local_f0 = (_Bit_pointer)((long)local_f0 + 1)) {
      rVar7 = core::std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_50,(size_type)local_f0);
      local_100 = rVar7;
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_100);
      if (bVar1) {
        pvVar3 = core::std::
                 vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>::
                 operator[]((vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>
                             *)&nr.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,(size_type)local_f0);
        core::std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)&i_1,&pvVar3->value);
      }
      else {
        pvVar3 = core::std::
                 vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>::
                 operator[]((vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>
                             *)&nr.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,(size_type)local_f0);
        std::__cxx11::string::string(local_120,(string *)&pvVar3->str);
        pvVar4 = core::std::
                 vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
                 ::operator[]((vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
                               *)local_98,(size_type)local_f0);
        sVar5 = core::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::count(pvVar4,(key_type *)local_120);
        if (sVar5 == 0) {
          pvVar4 = core::std::
                   vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
                   ::operator[]((vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
                                 *)local_98,(size_type)local_f0);
          sVar5 = core::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::size(pvVar4);
          local_12c = (mapped_type)sVar5;
          pvVar4 = core::std::
                   vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
                   ::operator[]((vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
                                 *)local_98,(size_type)local_f0);
          pmVar6 = core::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::operator[](pvVar4,(key_type *)local_120);
          *pmVar6 = (mapped_type)sVar5;
          local_130 = (float)local_12c;
          core::std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)&i_1,&local_130);
        }
        else {
          pvVar4 = core::std::
                   vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
                   ::operator[]((vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
                                 *)local_98,(size_type)local_f0);
          pmVar6 = core::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::operator[](pvVar4,(key_type *)local_120);
          labelIndex_1 = *pmVar6;
          local_128 = (float)labelIndex_1;
          core::std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)&i_1,&local_128);
        }
        std::__cxx11::string::~string(local_120);
      }
    }
    core::std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&i_1);
    core::std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)&i_1);
    core::std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>::
    ~vector((vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_> *)
            &nr.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<const_std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>_*,_std::vector<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>,_std::allocator<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>_>_>_>
    ::operator++(&__end2);
  }
  __range2._6_1_ = 1;
  core::std::
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
  ::~vector((vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
             *)local_98);
  core::std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)local_50);
  return __return_storage_ptr__;
}

Assistant:

NumericTable
    convertToNumeric(const MixedTable &t) {
        // analyze table
        size_t ncols = t.at(0).size();
        std::vector<bool> isNumeric(ncols);
        for (size_t i = 0; i < ncols; ++i) {
            isNumeric[i] = isColumnNumeric(t, i);
        }
        // convert table
        std::vector<std::map<std::string, int>> columnKeys(ncols);
        NumericTable nt;
        for (auto row : t) {
            NumericRow nr;
            for (size_t i = 0; i < ncols; ++i) {
                if (isNumeric[i]) {
                    nr.push_back(row[i].value);
                } else { // a non-numeric label
                    auto label = row[i].str;
                    if (columnKeys[i].count(label)) { // a previosly seen label
                        int labelIndex = columnKeys[i][label];
                        nr.push_back(labelIndex);
                    } else { // new label
                        int labelIndex = columnKeys[i].size();
                        columnKeys[i][label] = labelIndex;
                        nr.push_back(labelIndex);
                    }
                }
            }
            nt.push_back(nr);
        }
        return nt;
    }